

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  Result rhs;
  Enum EVar2;
  char *pcVar3;
  pointer log_stream;
  uchar *data;
  size_type size;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename;
  string local_590;
  Enum local_56c;
  undefined1 local_568 [8];
  FileStream stream;
  string_view local_528;
  undefined1 local_518 [8];
  FileStream h_stream;
  undefined1 local_4d0 [8];
  FileStream c_stream;
  string_view local_488;
  string local_478;
  undefined1 local_458 [8];
  string header_name;
  Result dummy_result;
  undefined1 local_420 [8];
  ValidateOptions options_1;
  undefined1 local_408 [8];
  ReadBinaryOptions options;
  undefined1 local_3e0 [6];
  bool kFailOnCustomSectionError;
  bool kStopOnFirstError;
  Module module;
  Errors errors;
  string_view local_50;
  Enum local_3c;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Result result;
  char **argv_local;
  int argc_local;
  
  wabt::Result::Result
            ((Result *)
             ((long)&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  wabt::string_view::string_view(&local_50,pcVar3);
  filename.size_ = (size_type)local_38;
  filename.data_ = (char *)local_50.size_;
  local_3c = (Enum)wabt::ReadFile((wabt *)local_50.data_,filename,in_RCX);
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_3c;
  bVar1 = wabt::Succeeded((Result)local_3c);
  if (bVar1) {
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
    wabt::Module::Module((Module *)local_3e0);
    options._31_1_ = 1;
    options._30_1_ = 1;
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)local_408,&s_features,&log_stream->super_Stream,
               (bool)(s_read_debug_names & 1),true,true);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    options_1.features._8_4_ =
         wabt::ReadBinaryIr(pcVar3,data,size,(ReadBinaryOptions *)local_408,
                            (Errors *)
                            &module.elem_segment_bindings.
                             super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                             ._M_h._M_single_bucket,(Module *)local_3e0);
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)options_1.features._8_4_;
    bVar1 = wabt::Succeeded((Result)options_1.features._8_4_);
    if (bVar1) {
      options_1.features.simd_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._4_1_;
      options_1.features.threads_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._5_1_;
      options_1.features.multi_value_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._6_1_;
      options_1.features.tail_call_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._7_1_;
      bVar1 = wabt::Succeeded(file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (bVar1) {
        wabt::ValidateOptions::ValidateOptions((ValidateOptions *)local_420,&s_features);
        file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             wabt::ValidateModule
                       ((Module *)local_3e0,
                        (Errors *)
                        &module.elem_segment_bindings.
                         super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                         ._M_h._M_single_bucket,(ValidateOptions *)local_420);
        rhs = wabt::GenerateNames((Module *)local_3e0,None);
        wabt::Result::operator|=
                  ((Result *)
                   ((long)&file_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 4),rhs);
      }
      bVar1 = wabt::Succeeded(file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (bVar1) {
        wabt::ApplyNames((Module *)local_3e0);
      }
      header_name.field_2._12_4_ =
           file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      bVar1 = wabt::Succeeded(file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (bVar1) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          wabt::string_view::string_view
                    ((string_view *)&c_stream.should_close_,&s_outfile_abi_cxx11_);
          local_488 = strip_extension(stack0xfffffffffffffb68);
          wabt::string_view::to_string_abi_cxx11_(&local_478,&local_488);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_458,&local_478,".h");
          std::__cxx11::string::~string((string *)&local_478);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          wabt::string_view::string_view((string_view *)&h_stream.should_close_,pcVar3);
          wabt::FileStream::FileStream
                    ((FileStream *)local_4d0,stack0xfffffffffffffb20,(Stream *)0x0);
          wabt::string_view::string_view(&local_528,(string *)local_458);
          wabt::FileStream::FileStream((FileStream *)local_518,local_528,(Stream *)0x0);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          stream._52_4_ =
               wabt::WriteC((Stream *)local_4d0,(Stream *)local_518,pcVar3,(Module *)local_3e0,
                            (WriteCOptions *)&s_write_c_options);
          file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)stream._52_4_;
          wabt::FileStream::~FileStream((FileStream *)local_518);
          wabt::FileStream::~FileStream((FileStream *)local_4d0);
          std::__cxx11::string::~string((string *)local_458);
        }
        else {
          wabt::FileStream::FileStream((FileStream *)local_568,_stdout,(Stream *)0x0);
          local_56c = (Enum)wabt::WriteC((Stream *)local_568,(Stream *)local_568,"wasm.h",
                                         (Module *)local_3e0,(WriteCOptions *)&s_write_c_options);
          file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_56c;
          wabt::FileStream::~FileStream((FileStream *)local_568);
        }
      }
    }
    file = _stderr;
    std::__cxx11::string::string((string *)&local_590);
    wabt::FormatErrorsToFile
              ((Errors *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket,Binary,(LexerSourceLineFinder *)0x0,file,&local_590,Never,
               0x50);
    std::__cxx11::string::~string((string *)&local_590);
    wabt::Module::~Module((Module *)local_3e0);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
  }
  EVar2 = wabt::Result::operator_cast_to_Enum
                    ((Result *)
                     ((long)&file_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    const bool kFailOnCustomSectionError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              kFailOnCustomSectionError);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
        result |= GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        if (!s_outfile.empty()) {
          std::string header_name =
              strip_extension(s_outfile).to_string() + ".h";
          FileStream c_stream(s_outfile.c_str());
          FileStream h_stream(header_name);
          result = WriteC(&c_stream, &h_stream, header_name.c_str(), &module,
                          s_write_c_options);
        } else {
          FileStream stream(stdout);
          result =
              WriteC(&stream, &stream, "wasm.h", &module, s_write_c_options);
        }
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}